

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void fmt::v6::detail::fallback_format<double>(double d,buffer<char> *buf,int *exp10)

{
  char *pcVar1;
  bool bVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  type tVar6;
  bigint *lhs2;
  uint64_t value_00;
  int iVar7;
  long lVar8;
  uint uVar9;
  bigint *local_330;
  fp value;
  bigint denominator;
  bigint numerator;
  bigint lower;
  bigint upper_store;
  
  numerator.bigits_.super_buffer<unsigned_int>.size_ = 0;
  numerator.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_001f1ca0;
  numerator.bigits_.super_buffer<unsigned_int>.ptr_ = numerator.bigits_.store_;
  numerator.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  numerator.exp_ = 0;
  denominator.bigits_.super_buffer<unsigned_int>.size_ = 0;
  denominator.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_001f1ca0;
  denominator.bigits_.super_buffer<unsigned_int>.ptr_ = denominator.bigits_.store_;
  denominator.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  denominator.exp_ = 0;
  lower.bigits_.super_buffer<unsigned_int>.size_ = 0;
  lower.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_001f1ca0;
  lower.bigits_.super_buffer<unsigned_int>.ptr_ = lower.bigits_.store_;
  lower.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  lower.exp_ = 0;
  local_330 = &upper_store;
  upper_store.bigits_.super_buffer<unsigned_int>.size_ = 0;
  upper_store.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_001f1ca0;
  upper_store.bigits_.super_buffer<unsigned_int>.ptr_ = upper_store.bigits_.store_;
  upper_store.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  upper_store.exp_ = 0;
  value.f = 0;
  value.e = 0;
  bVar2 = fp::assign<double,_0>(&value,d);
  iVar7 = bVar2 + 1;
  value_00 = value.f << (sbyte)iVar7;
  if (value.e < 0) {
    if (*exp10 < 0) {
      bigint::assign_pow10(&numerator,-*exp10);
      bigint::assign(&lower,&numerator);
      if (bVar2) {
        local_330 = &upper_store;
        bigint::assign(local_330,&numerator);
        bigint::operator<<=(&upper_store,1);
      }
      else {
        local_330 = (bigint *)0x0;
      }
      bigint::operator*=(&numerator,value_00);
      bigint::assign(&denominator,1);
      bigint::operator<<=(&denominator,iVar7 - value.e);
    }
    else {
      bigint::assign(&numerator,value_00);
      bigint::assign_pow10(&denominator,*exp10);
      bigint::operator<<=(&denominator,iVar7 - value.e);
      bigint::assign(&lower,1);
      if (bVar2) {
        bigint::assign(&upper_store,2);
      }
      else {
        local_330 = (bigint *)0x0;
      }
    }
  }
  else {
    bigint::assign(&numerator,value_00);
    bigint::operator<<=(&numerator,value.e);
    bigint::assign(&lower,1);
    bigint::operator<<=(&lower,value.e);
    if (bVar2) {
      local_330 = &upper_store;
      bigint::assign(local_330,1);
      bigint::operator<<=(&upper_store,value.e + 1);
    }
    else {
      local_330 = (bigint *)0x0;
    }
    bigint::assign_pow10(&denominator,*exp10);
    bigint::operator<<=(&denominator,1);
  }
  lhs2 = local_330;
  if (local_330 == (bigint *)0x0) {
    lhs2 = &lower;
  }
  pcVar1 = buf->ptr_;
  uVar9 = ~(uint)value.f & 1;
  lVar8 = 0;
  while( true ) {
    uVar4 = bigint::divmod_assign(&numerator,&denominator);
    iVar7 = compare(&numerator,&lower);
    iVar5 = add_compare(&numerator,lhs2,&denominator);
    pcVar1[lVar8] = (char)uVar4 + '0';
    if ((iVar7 < (int)uVar9) || ((int)-uVar9 < iVar5)) break;
    bigint::multiply(&numerator,10);
    bigint::multiply(&lower,10);
    if (local_330 != (bigint *)0x0) {
      bigint::multiply(local_330,10);
    }
    lVar8 = lVar8 + 1;
  }
  if (iVar7 < (int)uVar9) {
    if (iVar5 <= (int)-uVar9) goto LAB_0016e1ec;
    iVar7 = add_compare(&numerator,&numerator,&denominator);
    if ((iVar7 < 1) && ((uVar4 & 1) == 0 || iVar7 != 0)) goto LAB_0016e1ec;
    cVar3 = pcVar1[lVar8] + '\x01';
  }
  else {
    cVar3 = (char)uVar4 + '1';
  }
  pcVar1[lVar8] = cVar3;
LAB_0016e1ec:
  tVar6 = to_unsigned<int>((int)lVar8 + 1);
  buffer<char>::resize(buf,(ulong)tVar6);
  *exp10 = *exp10 - (int)lVar8;
  bigint::~bigint(&upper_store);
  bigint::~bigint(&lower);
  bigint::~bigint(&denominator);
  bigint::~bigint(&numerator);
  return;
}

Assistant:

void fallback_format(Double d, buffer<char>& buf, int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  fp value;
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  // TODO: handle float
  int shift = value.assign(d) ? 2 : 1;
  uint64_t significand = value.f << shift;
  if (value.e >= 0) {
    numerator.assign(significand);
    numerator <<= value.e;
    lower.assign(1);
    lower <<= value.e;
    if (shift != 1) {
      upper_store.assign(1);
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= 1;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (shift != 1) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= significand;
    denominator.assign(1);
    denominator <<= shift - value.e;
  } else {
    numerator.assign(significand);
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower.assign(1);
    if (shift != 1) {
      upper_store.assign(1ULL << 1);
      upper = &upper_store;
    }
  }
  if (!upper) upper = &lower;
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  bool even = (value.f & 1) == 0;
  int num_digits = 0;
  char* data = buf.data();
  for (;;) {
    int digit = numerator.divmod_assign(denominator);
    bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
    // numerator + upper >[=] pow10:
    bool high = add_compare(numerator, *upper, denominator) + even > 0;
    data[num_digits++] = static_cast<char>('0' + digit);
    if (low || high) {
      if (!low) {
        ++data[num_digits - 1];
      } else if (high) {
        int result = add_compare(numerator, numerator, denominator);
        // Round half to even.
        if (result > 0 || (result == 0 && (digit % 2) != 0))
          ++data[num_digits - 1];
      }
      buf.resize(to_unsigned(num_digits));
      exp10 -= num_digits - 1;
      return;
    }
    numerator *= 10;
    lower *= 10;
    if (upper != &lower) *upper *= 10;
  }
}